

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask3_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 3 | *out;
  *out = in[2] << 6 | *out;
  *out = in[3] << 9 | *out;
  *out = in[4] << 0xc | *out;
  *out = in[5] << 0xf | *out;
  *out = in[6] << 0x12 | *out;
  *out = in[7] << 0x15 | *out;
  *out = in[8] << 0x18 | *out;
  *out = in[9] << 0x1b | *out;
  *out = in[10] << 0x1e | *out;
  puVar1 = out + 1;
  *puVar1 = in[10] >> 2;
  *puVar1 = in[0xb] << 1 | *puVar1;
  *puVar1 = in[0xc] << 4 | *puVar1;
  *puVar1 = in[0xd] << 7 | *puVar1;
  *puVar1 = in[0xe] << 10 | *puVar1;
  *puVar1 = in[0xf] << 0xd | *puVar1;
  *puVar1 = in[0x10] << 0x10 | *puVar1;
  *puVar1 = in[0x11] << 0x13 | *puVar1;
  *puVar1 = in[0x12] << 0x16 | *puVar1;
  *puVar1 = in[0x13] << 0x19 | *puVar1;
  *puVar1 = in[0x14] << 0x1c | *puVar1;
  *puVar1 = in[0x15] << 0x1f | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[0x15] >> 1;
  *puVar1 = in[0x16] << 2 | *puVar1;
  *puVar1 = in[0x17] << 5 | *puVar1;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask3_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 27;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (3 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 28;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (3 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 5;
  ++in;

  return out + 1;
}